

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

void __thiscall gimage::Histogram::sumRows(Histogram *this,Histogram *colhist)

{
  unsigned_long **ppuVar1;
  unsigned_long **ppuVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int i;
  ulong uVar6;
  
  setSize(colhist,this->w,1,this->bs);
  clear(colhist);
  uVar4 = 0;
  uVar3 = (ulong)(uint)this->w;
  if (this->w < 1) {
    uVar3 = uVar4;
  }
  uVar5 = (ulong)(uint)this->h;
  if (this->h < 1) {
    uVar5 = uVar4;
  }
  for (; uVar4 != uVar5; uVar4 = uVar4 + 1) {
    ppuVar1 = this->row;
    ppuVar2 = colhist->row;
    for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
      ppuVar2[1][uVar6] = ppuVar2[1][uVar6] + ppuVar1[uVar4][uVar6];
    }
  }
  return;
}

Assistant:

void Histogram::sumRows(Histogram &colhist) const
{
  colhist.setSize(w, 1, bs);
  colhist.clear();

  for (int k=0; k<h; k++)
  {
    for (int i=0; i<w; i++)
    {
      colhist(i, 1)+=row[k][i];
    }
  }
}